

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa-i2c.c
# Opt level: O0

int process_command(int argc,char **argv)

{
  int iVar1;
  mraa_result_t mVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool local_38;
  uint8_t value;
  uint8_t register_address_1;
  uint8_t device_address_1;
  int bus_2;
  uint8_t data;
  uint8_t register_address;
  uint uStack_28;
  uint8_t device_address;
  int bus_1;
  mraa_boolean_t should_repeat;
  int interation;
  int bus;
  int status;
  char **argv_local;
  int argc_local;
  
  interation = 0;
  _bus = argv;
  argv_local._0_4_ = argc;
  iVar1 = strncmp(argv[1],"help",5);
  if (iVar1 == 0) {
    print_help();
    argv_local._4_4_ = 0;
  }
  else {
    iVar1 = strncmp(_bus[1],"version",8);
    if (iVar1 == 0) {
      print_version();
      argv_local._4_4_ = 0;
    }
    else {
      iVar1 = strncmp(_bus[1],"list",5);
      if (iVar1 == 0) {
        print_busses();
        argv_local._4_4_ = 0;
      }
      else {
        iVar1 = strncmp(_bus[1],"detect",7);
        if (iVar1 == 0) {
          if ((int)argv_local == 3) {
            lVar3 = strtol(_bus[2],(char **)0x0,0);
            should_repeat = (mraa_boolean_t)lVar3;
            i2c_detect_devices(should_repeat);
            argv_local._4_4_ = 0;
          }
          else {
            print_command_error();
            argv_local._4_4_ = 1;
          }
        }
        else {
          iVar1 = strncmp(_bus[1],"get",4);
          if ((iVar1 == 0) || (iVar1 = strncmp(_bus[1],"getrpt",7), iVar1 == 0)) {
            if ((int)argv_local == 5) {
              bus_1 = 0;
              iVar1 = strncmp(_bus[1],"getrpt",7);
              uStack_28 = (uint)(iVar1 == 0);
              lVar3 = strtol(_bus[2],(char **)0x0,0);
              bus_2 = (int)lVar3;
              lVar3 = strtol(_bus[3],(char **)0x0,0);
              device_address_1 = (uint8_t)lVar3;
              lVar3 = strtol(_bus[4],(char **)0x0,0);
              register_address_1 = (uint8_t)lVar3;
              do {
                mVar2 = i2c_get(bus_2,device_address_1,register_address_1,&value);
                if (mVar2 == MRAA_SUCCESS) {
                  if (uStack_28 != 0) {
                    fprintf(_stdout,"%4d: ",(ulong)(uint)bus_1);
                  }
                  fprintf(_stdout,"Register %#02X = %#02X\n",(ulong)register_address_1,(ulong)value)
                  ;
                  interation = 0;
                }
                else {
                  fprintf(_stdout,"i2c get failed\n");
                  interation = 1;
                }
                bus_1 = bus_1 + 1;
                usleep(10000);
                local_38 = uStack_28 != 0 && interation == 0;
              } while (local_38);
            }
            else {
              print_command_error();
              interation = 1;
            }
            argv_local._4_4_ = interation;
          }
          else {
            iVar1 = strncmp(_bus[1],"set",4);
            if (iVar1 == 0) {
              if ((int)argv_local == 6) {
                lVar3 = strtol(_bus[2],(char **)0x0,0);
                uVar4 = strtol(_bus[3],(char **)0x0,0);
                uVar5 = strtol(_bus[4],(char **)0x0,0);
                uVar6 = strtol(_bus[5],(char **)0x0,0);
                fprintf(_stdout,"Device %02X, Register = %02X, Value = %02X\n",uVar4 & 0xff,
                        uVar5 & 0xff,uVar6 & 0xff);
                mVar2 = i2c_set((int)lVar3,(uint8_t)uVar4,(uint8_t)uVar5,(uint8_t)uVar6);
                if (mVar2 == MRAA_SUCCESS) {
                  argv_local._4_4_ = 1;
                }
                else {
                  fprintf(_stdout,"i2c set failed\n");
                  argv_local._4_4_ = 0;
                }
              }
              else {
                print_command_error();
                argv_local._4_4_ = 1;
              }
            }
            else {
              print_command_error();
              argv_local._4_4_ = 1;
            }
          }
        }
      }
    }
  }
  return argv_local._4_4_;
}

Assistant:

int
process_command(int argc, char** argv)
{
    int status = 0;
    if (strncmp(argv[1], "help", strlen("help") + 1) == 0) {
        print_help();
        return 0;
    } else if (strncmp(argv[1], "version", strlen("version") + 1) == 0) {
        print_version();
        return 0;
    } else if (strncmp(argv[1], "list", strlen("list") + 1) == 0) {
        print_busses();
        return 0;
    } else if (strncmp(argv[1], "detect", strlen("detect") + 1) == 0) {
        if (argc == 3) {
            int bus = strtol(argv[2], NULL, 0);
            i2c_detect_devices(bus);
            return 0;
        } else {
            print_command_error();
            return 1;
        }
    } else if ((strncmp(argv[1], "get", strlen("get") + 1) == 0) ||
               (strncmp(argv[1], "getrpt", strlen("getrpt") + 1) == 0)) {
        if (argc == 5) {
            int interation = 0;
            mraa_boolean_t should_repeat = strncmp(argv[1], "getrpt", strlen("getrpt") + 1) == 0;
            int bus = strtol(argv[2], NULL, 0);
            uint8_t device_address = strtol(argv[3], NULL, 0);
            uint8_t register_address = strtol(argv[4], NULL, 0);
            // fprintf(stdout, "Device %02X, Register = %02X\n", device_address, register_address);
            uint8_t data;
            do {
                if (i2c_get(bus, device_address, register_address, &data) == MRAA_SUCCESS) {
                    if (should_repeat)
                        fprintf(stdout, "%4d: ", interation);
                    fprintf(stdout, "Register %#02X = %#02X\n", register_address, data);
                    status = 0;
                } else {
                    fprintf(stdout, "i2c get failed\n");
                    status = 1;
                }
                interation++;
                usleep(10000);
            } while (should_repeat && status == 0);
        } else {
            print_command_error();
            status = 1;
        }
        return status;
    } else if ((strncmp(argv[1], "set", strlen("set") + 1) == 0)) {
        if (argc == 6) {
            int bus = strtol(argv[2], NULL, 0);
            uint8_t device_address = strtol(argv[3], NULL, 0);
            uint8_t register_address = strtol(argv[4], NULL, 0);
            uint8_t value = strtol(argv[5], NULL, 0);
            fprintf(stdout, "Device %02X, Register = %02X, Value = %02X\n", device_address,
                    register_address, value);
            if (i2c_set(bus, device_address, register_address, value) != MRAA_SUCCESS) {
                fprintf(stdout, "i2c set failed\n");
                return 0;
            }
            return 1;
        } else {
            print_command_error();
            return 1;
        }
    } else {
        print_command_error();
        return 1;
    }
}